

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::_ClearFreeMemory(ImDrawList *this)

{
  ImDrawListSplitter *in_RDI;
  
  ImVector<ImDrawCmd>::clear((ImVector<ImDrawCmd> *)in_RDI);
  ImVector<unsigned_short>::clear((ImVector<unsigned_short> *)in_RDI);
  ImVector<ImDrawVert>::clear((ImVector<ImDrawVert> *)in_RDI);
  in_RDI[2]._Current = 0;
  in_RDI[2]._Count = 0;
  *(ImDrawCmd **)(in_RDI + 3) = (ImDrawCmd *)0x0;
  in_RDI[3]._Channels.Size = 0;
  in_RDI[3]._Channels.Capacity = 0;
  ImVector<ImVec4>::clear((ImVector<ImVec4> *)in_RDI);
  ImVector<void_*>::clear((ImVector<void_*> *)in_RDI);
  ImVector<ImVec2>::clear((ImVector<ImVec2> *)in_RDI);
  ImDrawListSplitter::ClearFreeMemory(in_RDI);
  return;
}

Assistant:

void ImDrawList::_ClearFreeMemory()
{
    CmdBuffer.clear();
    IdxBuffer.clear();
    VtxBuffer.clear();
    Flags = ImDrawListFlags_None;
    _VtxCurrentIdx = 0;
    _VtxWritePtr = NULL;
    _IdxWritePtr = NULL;
    _ClipRectStack.clear();
    _TextureIdStack.clear();
    _Path.clear();
    _Splitter.ClearFreeMemory();
}